

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O2

void __thiscall cppnet::PoolAlloter::~PoolAlloter(PoolAlloter *this)

{
  element_type *peVar1;
  char *in_RAX;
  pointer ppcVar2;
  void *data;
  char *local_28;
  
  (this->super_Alloter)._vptr_Alloter = (_func_int **)&PTR__PoolAlloter_00125708;
  local_28 = in_RAX;
  for (ppcVar2 = (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar2 !=
      (this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    if (*ppcVar2 != (char *)0x0) {
      peVar1 = (this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      local_28 = *ppcVar2;
      (*peVar1->_vptr_Alloter[5])(peVar1,&local_28,0);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_alloter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&(this->_malloc_vec).super__Vector_base<char_*,_std::allocator<char_*>_>);
  std::_Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
  ::~_Vector_base(&(this->_free_list).
                   super__Vector_base<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>
                 );
  return;
}

Assistant:

PoolAlloter::~PoolAlloter() {
    for (auto iter = _malloc_vec.begin(); iter != _malloc_vec.end(); ++iter) {
        if (*iter) {
            void* data = (void*)*iter;
            _alloter->Free(data);
        }
    }
}